

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# nullc.cpp
# Opt level: O0

NULLCRef * nullcGetLastErrorObject(void)

{
  NULLCRef *in_RDI;
  undefined8 local_14;
  NULLCRef empty;
  
  memset(&local_14,0,0xc);
  if ((NULLC::initialized & 1) == 0) {
    NULLC::nullcLastError = "ERROR: NULLC is not initialized";
    *(undefined8 *)in_RDI = local_14;
    *(uint *)((long)&in_RDI->ptr + 4) = empty.typeID;
  }
  else if (NULLC::currExec == 1) {
    ExecutorX86::GetErrorObject(in_RDI,NULLC::executorX86);
  }
  else if (NULLC::currExec == 0) {
    ExecutorRegVm::GetErrorObject(in_RDI,NULLC::executorRegVm);
  }
  else {
    *(undefined8 *)in_RDI = local_14;
    *(uint *)((long)&in_RDI->ptr + 4) = empty.typeID;
  }
  return in_RDI;
}

Assistant:

NULLCRef nullcGetLastErrorObject()
{
	using namespace NULLC;
	NULLCRef empty = { 0, 0 };
	NULLC_CHECK_INITIALIZED(empty);

#ifdef NULLC_BUILD_X86_JIT
	if(currExec == NULLC_X86)
		return executorX86->GetErrorObject();
#endif
#if defined(NULLC_LLVM_SUPPORT) && !defined(NULLC_NO_EXECUTOR)
	if(currExec == NULLC_LLVM)
		return executorLLVM->GetErrorObject();
#endif
#ifndef NULLC_NO_EXECUTOR
	if(currExec == NULLC_REG_VM)
		return executorRegVm->GetErrorObject();
#endif

	return empty;
}